

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

MPP_RET fill_image(RK_U8 *buf,RK_U32 width,RK_U32 height,RK_U32 hor_stride,RK_U32 ver_stride,
                  MppFrameFormat fmt,RK_U32 frame_count)

{
  FillRgbFunc p_Var1;
  int iVar2;
  char cVar3;
  RK_S32 RVar4;
  MPP_RET MVar5;
  MppFrameFormat MVar6;
  uint uVar7;
  uint uVar8;
  RK_U8 RVar9;
  undefined4 in_register_00000084;
  char *fmt_name;
  ulong uVar10;
  RK_U8 *pRVar11;
  RK_U8 RVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  RK_U32 RVar16;
  RK_U8 *pRVar17;
  RK_U32 RVar18;
  RK_U32 B;
  RK_U32 G;
  RK_U32 R;
  RK_U32 local_3c;
  ulong local_38;
  
  fmt_name = (char *)CONCAT44(in_register_00000084,ver_stride);
  MVar6 = fmt & 0xfffff;
  uVar7 = MVar6 - MPP_FMT_RGB565;
  if (uVar7 < 0xe) {
    local_3c = height;
    if ((0x3fU >> (uVar7 & 0x1f) & 1) == 0) {
      if ((0x3f00U >> (uVar7 & 0x1f) & 1) == 0) {
        p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
        RVar4 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,3);
        if (RVar4 != 0) {
          hor_stride = hor_stride * 3;
          fill_image_is_pixel_stride = 1;
        }
        RVar4 = util_check_8_pixel_aligned
                          ((uint)fill_image_not_8_pixel,hor_stride,3,0x1065c9,fmt_name);
        if (RVar4 != 0) {
          hor_stride = (hor_stride + 0x17) - (hor_stride + 0x17) % 0x18;
          fill_image_not_8_pixel = 1;
        }
        local_38 = (ulong)hor_stride;
        for (RVar18 = 0; RVar18 != local_3c; RVar18 = RVar18 + 1) {
          uVar7 = 0;
          for (RVar16 = 0; width != RVar16; RVar16 = RVar16 + 1) {
            get_rgb_color(&R,&G,&B,RVar16,RVar18,frame_count);
            (*p_Var1)(buf + uVar7,R,G,B,SUB14((fmt >> 0x18 & 1) == 0,0));
            uVar7 = uVar7 + 3;
          }
          buf = buf + local_38;
        }
      }
      else {
        p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
        RVar4 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,4);
        if (RVar4 != 0) {
          hor_stride = hor_stride << 2;
          fill_image_is_pixel_stride = 1;
        }
        RVar4 = util_check_8_pixel_aligned
                          ((uint)fill_image_not_8_pixel,hor_stride,4,0x1065bf,fmt_name);
        if (RVar4 != 0) {
          hor_stride = hor_stride + 0x1f & 0xffffffe0;
          fill_image_not_8_pixel = 1;
        }
        local_38 = (ulong)hor_stride;
        for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
          uVar7 = 0;
          for (RVar16 = 0; width != RVar16; RVar16 = RVar16 + 1) {
            get_rgb_color(&R,&G,&B,RVar16,RVar18,frame_count);
            (*p_Var1)(buf + uVar7,R,G,B,SUB14((fmt >> 0x18 & 1) == 0,0));
            uVar7 = uVar7 + 4;
          }
          buf = buf + local_38;
          height = local_3c;
        }
      }
    }
    else {
      p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
      RVar4 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,2);
      if (RVar4 != 0) {
        hor_stride = hor_stride * 2;
        fill_image_is_pixel_stride = 1;
      }
      RVar4 = util_check_8_pixel_aligned
                        ((uint)fill_image_not_8_pixel,hor_stride,2,0x1065b5,fmt_name);
      if (RVar4 != 0) {
        hor_stride = hor_stride + 0xf & 0xfffffff0;
        fill_image_not_8_pixel = 1;
      }
      local_38 = (ulong)hor_stride;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        uVar7 = 0;
        for (RVar16 = 0; width != RVar16; RVar16 = RVar16 + 1) {
          get_rgb_color(&R,&G,&B,RVar16,RVar18,frame_count);
          (*p_Var1)(buf + uVar7,R,G,B,SUB14((fmt >> 0x18 & 1) == 0,0));
          uVar7 = uVar7 + 2;
        }
        buf = buf + local_38;
        height = local_3c;
      }
    }
    return MPP_OK;
  }
  if (MVar6 < MPP_FMT_YUV444SP_10BIT) {
    uVar7 = ver_stride * hor_stride;
    pRVar17 = buf + uVar7;
    cVar3 = (char)frame_count;
    switch(MVar6) {
    case MPP_FMT_YUV420SP:
      uVar7 = frame_count * 3 & 0xff;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
          buf[uVar10] = (char)uVar7 + (char)uVar10;
        }
        buf = buf + hor_stride;
        uVar7 = uVar7 + 1;
      }
      MVar5 = MPP_OK;
      for (uVar7 = 0; uVar7 != height >> 1; uVar7 = uVar7 + 1) {
        for (uVar10 = 0; width >> 1 != uVar10; uVar10 = uVar10 + 1) {
          pRVar17[uVar10 * 2] = ((byte)uVar7 ^ 0x80) + cVar3 * '\x02';
          pRVar17[uVar10 * 2 + 1] = cVar3 * '\x05' + '@' + (char)uVar10;
        }
        pRVar17 = pRVar17 + hor_stride;
      }
      break;
    default:
      goto switchD_001042cd_caseD_1;
    case MPP_FMT_YUV422SP:
      uVar7 = frame_count * 3 & 0xff;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
          buf[uVar10] = (char)uVar7 + (char)uVar10;
        }
        buf = buf + hor_stride;
        uVar7 = uVar7 + 1;
      }
      MVar5 = MPP_OK;
      for (uVar7 = 0; uVar7 != height; uVar7 = uVar7 + 1) {
        for (uVar10 = 0; width >> 1 != uVar10; uVar10 = uVar10 + 1) {
          pRVar17[uVar10 * 2] = ((byte)(uVar7 >> 1) ^ 0x80) + cVar3 * '\x02';
          pRVar17[uVar10 * 2 + 1] = cVar3 * '\x05' + '@' + (char)uVar10;
        }
        pRVar17 = pRVar17 + hor_stride;
      }
      break;
    case MPP_FMT_YUV420P:
      uVar8 = frame_count * 3 & 0xff;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
          buf[uVar10] = (char)uVar8 + (char)uVar10;
        }
        buf = buf + hor_stride;
        uVar8 = uVar8 + 1;
      }
      pRVar11 = pRVar17;
      for (uVar8 = 0; uVar8 != height >> 1; uVar8 = uVar8 + 1) {
        for (uVar10 = 0; width >> 1 != uVar10; uVar10 = uVar10 + 1) {
          pRVar11[uVar10] = ((byte)uVar8 ^ 0x80) + cVar3 * '\x02';
        }
        pRVar11 = pRVar11 + (hor_stride >> 1);
      }
      pRVar17 = pRVar17 + (uVar7 >> 2);
      MVar5 = MPP_OK;
      for (uVar7 = 0; uVar7 != height >> 1; uVar7 = uVar7 + 1) {
        for (uVar10 = 0; width >> 1 != uVar10; uVar10 = uVar10 + 1) {
          pRVar17[uVar10] = cVar3 * '\x05' + '@' + (char)uVar10;
        }
        pRVar17 = pRVar17 + (hor_stride >> 1);
      }
      break;
    case MPP_FMT_YUV420SP_VU:
      uVar7 = frame_count * 3 & 0xff;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
          buf[uVar10] = (char)uVar7 + (char)uVar10;
        }
        buf = buf + hor_stride;
        uVar7 = uVar7 + 1;
      }
      MVar5 = MPP_OK;
      for (uVar7 = 0; uVar7 != height >> 1; uVar7 = uVar7 + 1) {
        for (uVar10 = 0; width >> 1 != uVar10; uVar10 = uVar10 + 1) {
          pRVar17[uVar10 * 2 + 1] = ((byte)uVar7 ^ 0x80) + cVar3 * '\x02';
          pRVar17[uVar10 * 2] = cVar3 * '\x05' + '@' + (char)uVar10;
        }
        pRVar17 = pRVar17 + hor_stride;
      }
      break;
    case MPP_FMT_YUV422P:
      uVar8 = frame_count * 3 & 0xff;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
          buf[uVar10] = (char)uVar8 + (char)uVar10;
        }
        buf = buf + hor_stride;
        uVar8 = uVar8 + 1;
      }
      pRVar11 = pRVar17;
      for (uVar8 = 0; uVar8 != height; uVar8 = uVar8 + 1) {
        for (uVar10 = 0; width >> 1 != uVar10; uVar10 = uVar10 + 1) {
          pRVar11[uVar10] = ((byte)(uVar8 >> 1) ^ 0x80) + cVar3 * '\x02';
        }
        pRVar11 = pRVar11 + (hor_stride >> 1);
      }
      pRVar17 = pRVar17 + (uVar7 >> 1);
      MVar5 = MPP_OK;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width >> 1 != uVar10; uVar10 = uVar10 + 1) {
          pRVar17[uVar10] = cVar3 * '\x05' + '@' + (char)uVar10;
        }
        pRVar17 = pRVar17 + (hor_stride >> 1);
      }
      break;
    case MPP_FMT_YUV422SP_VU:
      uVar7 = frame_count * 3 & 0xff;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
          buf[uVar10] = (char)uVar7 + (char)uVar10;
        }
        buf = buf + hor_stride;
        uVar7 = uVar7 + 1;
      }
      MVar5 = MPP_OK;
      for (uVar7 = 0; uVar7 != height; uVar7 = uVar7 + 1) {
        for (uVar10 = 0; width >> 1 != uVar10; uVar10 = uVar10 + 1) {
          pRVar17[uVar10 * 2 + 1] = ((byte)(uVar7 >> 1) ^ 0x80) + cVar3 * '\x02';
          pRVar17[uVar10 * 2] = cVar3 * '\x05' + '@' + (char)uVar10;
        }
        pRVar17 = pRVar17 + hor_stride;
      }
      break;
    case MPP_FMT_YUV422_YUYV:
      uVar7 = frame_count * 3;
      MVar5 = MPP_OK;
      for (uVar8 = 0; uVar8 != height; uVar8 = uVar8 + 1) {
        RVar9 = cVar3 * '\x05' + '@';
        uVar13 = uVar7;
        for (uVar10 = 0; (ulong)(width >> 1) << 2 != uVar10; uVar10 = uVar10 + 4) {
          RVar12 = (RK_U8)uVar13;
          buf[uVar10 & 0xffffffff] = RVar12;
          iVar2 = (int)uVar10;
          buf[iVar2 + 2] = RVar12 + '\x01';
          buf[iVar2 + 1] = ((byte)(uVar8 >> 1) ^ 0x80) + cVar3 * '\x02';
          buf[iVar2 + 3] = RVar9;
          uVar13 = (uint)(byte)(RVar12 + 2);
          RVar9 = RVar9 + '\x01';
        }
        buf = buf + hor_stride;
        uVar7 = (uint)(byte)((char)uVar7 + 1);
      }
      break;
    case MPP_FMT_YUV422_YVYU:
      uVar7 = frame_count * 3;
      MVar5 = MPP_OK;
      for (uVar8 = 0; uVar8 != height; uVar8 = uVar8 + 1) {
        RVar9 = cVar3 * '\x05' + '@';
        uVar13 = uVar7;
        for (uVar10 = 0; (ulong)(width >> 1) << 2 != uVar10; uVar10 = uVar10 + 4) {
          RVar12 = (RK_U8)uVar13;
          buf[uVar10 & 0xffffffff] = RVar12;
          iVar2 = (int)uVar10;
          buf[iVar2 + 2] = RVar12 + '\x01';
          buf[iVar2 + 3] = ((byte)(uVar8 >> 1) ^ 0x80) + cVar3 * '\x02';
          buf[iVar2 + 1] = RVar9;
          uVar13 = (uint)(byte)(RVar12 + 2);
          RVar9 = RVar9 + '\x01';
        }
        buf = buf + hor_stride;
        uVar7 = (uint)(byte)((char)uVar7 + 1);
      }
      break;
    case MPP_FMT_YUV422_UYVY:
      uVar7 = frame_count * 3;
      MVar5 = MPP_OK;
      for (uVar8 = 0; uVar8 != height; uVar8 = uVar8 + 1) {
        RVar9 = cVar3 * '\x05' + '@';
        uVar13 = uVar7;
        for (uVar10 = 0; (ulong)(width >> 1) << 2 != uVar10; uVar10 = uVar10 + 4) {
          iVar2 = (int)uVar10;
          RVar12 = (RK_U8)uVar13;
          buf[iVar2 + 1] = RVar12;
          buf[iVar2 + 3] = RVar12 + '\x01';
          buf[uVar10 & 0xffffffff] = ((byte)(uVar8 >> 1) ^ 0x80) + cVar3 * '\x02';
          buf[iVar2 + 2] = RVar9;
          uVar13 = (uint)(byte)(RVar12 + 2);
          RVar9 = RVar9 + '\x01';
        }
        buf = buf + hor_stride;
        uVar7 = (uint)(byte)((char)uVar7 + 1);
      }
      break;
    case MPP_FMT_YUV422_VYUY:
      uVar7 = frame_count * 3;
      MVar5 = MPP_OK;
      for (uVar8 = 0; uVar8 != height; uVar8 = uVar8 + 1) {
        RVar9 = cVar3 * '\x05' + '@';
        uVar13 = uVar7;
        for (uVar10 = 0; (ulong)(width >> 1) << 2 != uVar10; uVar10 = uVar10 + 4) {
          iVar2 = (int)uVar10;
          RVar12 = (RK_U8)uVar13;
          buf[iVar2 + 1] = RVar12;
          buf[iVar2 + 3] = RVar12 + '\x01';
          buf[iVar2 + 2] = ((byte)(uVar8 >> 1) ^ 0x80) + cVar3 * '\x02';
          buf[uVar10 & 0xffffffff] = RVar9;
          uVar13 = (uint)(byte)(RVar12 + 2);
          RVar9 = RVar9 + '\x01';
        }
        buf = buf + hor_stride;
        uVar7 = (uint)(byte)((char)uVar7 + 1);
      }
      break;
    case MPP_FMT_YUV400:
      uVar7 = frame_count * 3 & 0xff;
      MVar5 = MPP_OK;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
          buf[uVar10] = (char)uVar7 + (char)uVar10;
        }
        buf = buf + hor_stride;
        uVar7 = uVar7 + 1;
      }
      break;
    case MPP_FMT_YUV444SP:
      uVar7 = frame_count * 3 & 0xff;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
          buf[uVar10] = (char)uVar7 + (char)uVar10;
        }
        buf = buf + hor_stride;
        uVar7 = uVar7 + 1;
      }
      MVar5 = MPP_OK;
      for (uVar7 = 0; uVar7 != height; uVar7 = uVar7 + 1) {
        RVar9 = cVar3 * '\x05' + '@';
        for (uVar10 = 0; (ulong)width * 2 != uVar10; uVar10 = uVar10 + 2) {
          pRVar17[uVar10 & 0xffffffff] = ((byte)(uVar7 >> 1) ^ 0x80) + cVar3 * '\x02';
          pRVar17[(int)uVar10 + 1] = RVar9;
          RVar9 = RVar9 + '\x01';
        }
        pRVar17 = pRVar17 + hor_stride * 2;
      }
      break;
    case MPP_FMT_YUV444P:
      uVar10 = (ulong)width;
      uVar8 = frame_count * 3 & 0xff;
      pRVar11 = buf;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
          pRVar11[uVar14] = (char)uVar8 + (char)uVar14;
        }
        pRVar11 = pRVar11 + hor_stride;
        uVar8 = uVar8 + 1;
      }
      for (uVar14 = 0; (RK_U32)uVar14 != height; uVar14 = (ulong)((RK_U32)uVar14 + 1)) {
        for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
          pRVar17[uVar15] = ((byte)(uVar14 >> 1) ^ 0x80) + cVar3 * '\x02';
        }
        pRVar17 = pRVar17 + hor_stride;
      }
      pRVar17 = buf + uVar7 * 2;
      MVar5 = MPP_OK;
      for (RVar18 = 0; RVar18 != height; RVar18 = RVar18 + 1) {
        for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
          pRVar17[uVar14] = cVar3 * '\x05' + '@' + (char)uVar14;
        }
        pRVar17 = pRVar17 + hor_stride;
      }
    }
  }
  else {
switchD_001042cd_caseD_1:
    _mpp_log_l(2,"utils","filling function do not support type %d\n","fill_image",fmt);
    MVar5 = MPP_NOK;
  }
  return MVar5;
}

Assistant:

MPP_RET fill_image(RK_U8 *buf, RK_U32 width, RK_U32 height,
                   RK_U32 hor_stride, RK_U32 ver_stride, MppFrameFormat fmt,
                   RK_U32 frame_count)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *buf_y = buf;
    RK_U8 *buf_c = buf + hor_stride * ver_stride;
    RK_U32 x, y, i;
    static RK_S32 is_pixel_stride = 0;
    static RK_S32 not_8_pixel = 0;

    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP : {
        fill_MPP_FMT_YUV420SP(buf, width, height, hor_stride, ver_stride, frame_count);
    } break;
    case MPP_FMT_YUV422SP : {
        fill_MPP_FMT_YUV422SP(buf, width, height, hor_stride, ver_stride, frame_count);
    } break;
    case MPP_FMT_YUV420P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height / 2; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 128 + y + frame_count * 2;
            }
        }

        p = buf_c + hor_stride * ver_stride / 4;
        for (y = 0; y < height / 2; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 64 + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV420SP_VU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height / 2; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 2 + 1] = 128 + y + frame_count * 2;
                p[x * 2 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 128 + y / 2 + frame_count * 2;
            }
        }

        p = buf_c + hor_stride * ver_stride / 2;
        for (y = 0; y < height; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 64 + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422SP_VU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 2 + 1] = 128 + y / 2 + frame_count * 2;
                p[x * 2 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_YUYV : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 0] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 2] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 1] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 3] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_YVYU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 0] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 2] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 3] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 1] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_UYVY : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 1] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 3] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 0] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 2] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_VYUY : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 1] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 3] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 2] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV400 : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }
    } break;
    case MPP_FMT_YUV444SP : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf + hor_stride * ver_stride;
        for (y = 0; y < height; y++, p += hor_stride * 2) {
            for (x = 0; x < width; x++) {
                p[x * 2 + 0] = 128 + y / 2 + frame_count * 2;
                p[x * 2 + 1] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV444P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }
        p = buf + hor_stride * ver_stride;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = 128 + y / 2 + frame_count * 2;
            }
        }
        p = buf + hor_stride * ver_stride * 2;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 2;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "16bit RGB")) {
            hor_stride = MPP_ALIGN(hor_stride, 16);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 4;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "32bit RGB")) {
            hor_stride = MPP_ALIGN(hor_stride, 32);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    case MPP_FMT_BGR888 :
    case MPP_FMT_RGB888 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 3;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "24bit RGB")) {
            hor_stride = MPP_ALIGN_GEN(hor_stride, 24);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    default : {
        mpp_err_f("filling function do not support type %d\n", fmt);
        ret = MPP_NOK;
    } break;
    }
    return ret;
}